

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O3

void __thiscall
filtered_directed_graph_t::filtered_directed_graph_t
          (filtered_directed_graph_t *this,filtered_directed_graph_t *big_graph,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *subset)

{
  vertex_index_t v_00;
  iterator iVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  unsigned_short v;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  vertex_indices;
  ushort local_ae;
  uint local_ac;
  filtered_directed_graph_t *local_a8;
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_a0;
  _Hash_node_base *local_98;
  filtered_directed_graph_t *local_90;
  ulong local_88;
  vector<float,_std::allocator<float>_> local_80;
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = (__buckets_ptr)((ulong)local_68._M_buckets & 0xffffffff00000000);
  local_a0 = &subset->_M_h;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_80,(subset->_M_h)._M_element_count,(value_type_conflict2 *)&local_68,
             (allocator_type *)&local_ac);
  local_a8 = this;
  filtered_directed_graph_t(this,&local_80,(big_graph->super_directed_graph_t).directed);
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var4 = (local_a0->_M_before_begin)._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    iVar5 = 0;
    do {
      local_ac = iVar5 << 0x10 | (uint)*(ushort *)&p_Var4[1]._M_nxt;
      std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_short,unsigned_short>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_68,&local_ac);
      iVar5 = iVar5 + 1;
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
    p_Var4 = (local_a0->_M_before_begin)._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      uVar3 = (big_graph->super_directed_graph_t).incidence_row_length;
      uVar6 = uVar3;
      local_90 = big_graph;
      do {
        local_ac = CONCAT22(local_ac._2_2_,*(undefined2 *)&p_Var4[1]._M_nxt);
        local_98 = p_Var4;
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar6 = (big_graph->super_directed_graph_t).incidence_outgoing.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[(ushort)local_ac * uVar6 + uVar8];
            if (uVar6 != 0) {
              local_88 = uVar8;
              do {
                uVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                uVar7 = (ushort)uVar3 | (ushort)(uVar8 << 6);
                local_ae = uVar7;
                iVar1 = std::
                        _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(local_a0,&local_ae);
                if (iVar1.super__Node_iterator_base<unsigned_short,_false>._M_cur !=
                    (__node_type *)0x0) {
                  pmVar2 = std::__detail::
                           _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&local_68,(key_type *)&local_ac);
                  v_00 = *pmVar2;
                  local_ae = uVar7;
                  pmVar2 = std::__detail::
                           _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&local_68,&local_ae);
                  add_filtered_edge(local_a8,v_00,*pmVar2,0.0);
                }
                uVar6 = uVar6 & ~(1L << (uVar3 & 0x3f));
              } while (uVar6 != 0);
              uVar3 = (local_90->super_directed_graph_t).incidence_row_length;
              big_graph = local_90;
              uVar8 = local_88;
            }
            uVar8 = uVar8 + 1;
            uVar6 = uVar3;
          } while (uVar8 < uVar3);
        }
        p_Var4 = local_98->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

filtered_directed_graph_t(filtered_directed_graph_t* big_graph, std::unordered_set<vertex_index_t> subset)
	    : filtered_directed_graph_t(std::vector<value_t>(subset.size(), 0), big_graph->directed) {
		// Add the edges
		std::unordered_map<vertex_index_t, vertex_index_t> vertex_indices;
		vertex_index_t index = 0;
		for (auto v : subset) vertex_indices.insert(std::make_pair(v, index++));

		for (auto v : subset) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < big_graph->incidence_row_length; offset++) {
				auto bits = big_graph->get_outgoing_chunk(v, offset);
				size_t vertex_offset = offset << 6;

				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					if (subset.find(vertex_index_t(vertex_offset + b)) != subset.end())
						add_filtered_edge(vertex_indices[v], vertex_indices[vertex_index_t(vertex_offset + b)], 0);
				}
			}
		}
	}